

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapHeapArgumentsInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  ScriptContext *this;
  SnapHeapArgumentsInfo *pSVar1;
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar2;
  RecyclableObject *local_30;
  RecyclableObject *activationObj;
  SnapHeapArgumentsInfo *argsInfo;
  ScriptContext *ctx;
  InflateMap *inflator_local;
  SnapObject *snpObject_local;
  
  this = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapHeapArgumentsInfo*,(TTD::NSSnapObjects::SnapObjectType)13>
                     (snpObject);
  if ((pSVar1->IsFrameNullPtr & 1U) == 0) {
    if (pSVar1->FrameObject == 0) {
      TTDAbort_unrecoverable_error("That won\'t work!");
    }
    local_30 = InflateMap::LookupObject(inflator,pSVar1->FrameObject);
  }
  else {
    local_30 = (RecyclableObject *)0x0;
  }
  this_00 = Js::ScriptContext::GetLibrary(this);
  pRVar2 = Js::JavascriptLibrary::CreateHeapArguments_TTD
                     (this_00,pSVar1->NumOfArguments,pSVar1->FormalCount,
                      (ActivationObject *)local_30,pSVar1->DeletedArgFlags);
  return pRVar2;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapHeapArgumentsInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            SnapHeapArgumentsInfo* argsInfo = SnapObjectGetAddtlInfoAs<SnapHeapArgumentsInfo*, SnapObjectType::SnapHeapArgumentsObject>(snpObject);

            Js::RecyclableObject* activationObj = nullptr;
            if(argsInfo->IsFrameNullPtr)
            {
                activationObj = nullptr;
            }
            else
            {
                TTDAssert(argsInfo->FrameObject != TTD_INVALID_PTR_ID, "That won't work!");

                activationObj = inflator->LookupObject(argsInfo->FrameObject);
            }

            return  ctx->GetLibrary()->CreateHeapArguments_TTD(argsInfo->NumOfArguments, argsInfo->FormalCount, static_cast<Js::ActivationObject*>(activationObj), argsInfo->DeletedArgFlags);
        }